

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O1

AffineSpace3fa * embree::fromQuaternionDecomposition(RTCQuaternionDecomposition *qdc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  AffineSpace3fa *in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  uVar5 = qdc->translation_y;
  uVar6 = qdc->translation_z;
  fVar1 = qdc->translation_x;
  fVar2 = qdc->quaternion_r;
  fVar3 = qdc->quaternion_i;
  fVar4 = qdc->quaternion_j;
  fVar19 = qdc->quaternion_k;
  fVar22 = fVar3 * fVar4 + fVar2 * fVar19;
  fVar7 = fVar3 * fVar4 - fVar2 * fVar19;
  fVar9 = fVar2 * fVar2 + fVar3 * fVar3 + -fVar4 * fVar4 + -fVar19 * fVar19;
  fVar20 = fVar2 * fVar2 - fVar3 * fVar3;
  fVar21 = fVar4 * fVar4 + fVar20 + -fVar19 * fVar19;
  fVar24 = fVar3 * fVar19 - fVar2 * fVar4;
  fVar14 = fVar2 * fVar4 + fVar3 * fVar19;
  fVar23 = fVar4 * fVar19 + fVar2 * fVar3;
  fVar18 = fVar4 * fVar19 - fVar2 * fVar3;
  fVar22 = fVar22 + fVar22;
  fVar24 = fVar24 + fVar24;
  fVar19 = fVar19 * fVar19 + fVar20 + -fVar4 * fVar4;
  fVar10 = fVar9 * 1.0 + fVar22 * 0.0 + fVar24 * 0.0;
  fVar11 = fVar9 * 0.0 + fVar22 * 1.0 + fVar24 * 0.0;
  fVar12 = fVar9 * 0.0 + fVar22 * 0.0 + fVar24 * 1.0;
  fVar13 = fVar9 * 0.0 + fVar22 * 0.0 + fVar24 * 0.0;
  fVar23 = fVar23 + fVar23;
  fVar7 = fVar7 + fVar7;
  fVar22 = fVar7 * 1.0 + fVar21 * 0.0 + fVar23 * 0.0;
  fVar24 = fVar7 * 0.0 + fVar21 * 1.0 + fVar23 * 0.0;
  fVar8 = fVar7 * 0.0 + fVar21 * 0.0 + fVar23 * 1.0;
  fVar21 = fVar7 * 0.0 + fVar21 * 0.0 + fVar23 * 0.0;
  fVar18 = fVar18 + fVar18;
  fVar2 = qdc->scale_x;
  fVar3 = qdc->scale_z;
  fVar14 = fVar14 + fVar14;
  fVar4 = qdc->shift_z;
  fVar23 = fVar14 * 1.0 + fVar18 * 0.0 + fVar19 * 0.0;
  fVar15 = fVar14 * 0.0 + fVar18 * 1.0 + fVar19 * 0.0;
  fVar16 = fVar14 * 0.0 + fVar18 * 0.0 + fVar19 * 1.0;
  fVar17 = fVar14 * 0.0 + fVar18 * 0.0 + fVar19 * 0.0;
  fVar19 = qdc->scale_y;
  fVar7 = qdc->skew_xy;
  fVar9 = qdc->skew_yz;
  fVar14 = qdc->skew_xz;
  fVar18 = qdc->shift_y;
  fVar20 = qdc->shift_x;
  (in_RDI->l).vx.field_0.m128[0] = fVar2 * fVar10 + fVar22 * 0.0 + fVar23 * 0.0;
  (in_RDI->l).vx.field_0.m128[1] = fVar2 * fVar11 + fVar24 * 0.0 + fVar15 * 0.0;
  (in_RDI->l).vx.field_0.m128[2] = fVar2 * fVar12 + fVar8 * 0.0 + fVar16 * 0.0;
  (in_RDI->l).vx.field_0.m128[3] = fVar2 * fVar13 + fVar21 * 0.0 + fVar17 * 0.0;
  (in_RDI->l).vy.field_0.m128[0] = fVar7 * fVar10 + fVar19 * fVar22 + fVar23 * 0.0;
  (in_RDI->l).vy.field_0.m128[1] = fVar7 * fVar11 + fVar19 * fVar24 + fVar15 * 0.0;
  (in_RDI->l).vy.field_0.m128[2] = fVar7 * fVar12 + fVar19 * fVar8 + fVar16 * 0.0;
  (in_RDI->l).vy.field_0.m128[3] = fVar7 * fVar13 + fVar19 * fVar21 + fVar17 * 0.0;
  (in_RDI->l).vz.field_0.m128[0] = fVar14 * fVar10 + fVar9 * fVar22 + fVar3 * fVar23;
  (in_RDI->l).vz.field_0.m128[1] = fVar14 * fVar11 + fVar9 * fVar24 + fVar3 * fVar15;
  (in_RDI->l).vz.field_0.m128[2] = fVar14 * fVar12 + fVar9 * fVar8 + fVar3 * fVar16;
  (in_RDI->l).vz.field_0.m128[3] = fVar14 * fVar13 + fVar9 * fVar21 + fVar3 * fVar17;
  (in_RDI->p).field_0.m128[0] = fVar20 * fVar10 + fVar18 * fVar22 + fVar4 * fVar23 + fVar1 + 0.0;
  (in_RDI->p).field_0.m128[1] =
       fVar20 * fVar11 + fVar18 * fVar24 + fVar4 * fVar15 + (float)uVar5 + 0.0;
  (in_RDI->p).field_0.m128[2] =
       fVar20 * fVar12 + fVar18 * fVar8 + fVar4 * fVar16 + (float)uVar6 + 0.0;
  (in_RDI->p).field_0.m128[3] = fVar20 * fVar13 + fVar18 * fVar21 + fVar4 * fVar17 + 0.0;
  return in_RDI;
}

Assistant:

AffineSpace3fa fromQuaternionDecomposition(const RTCQuaternionDecomposition& qdc)
{
  AffineSpace3fa T = AffineSpace3fa::scale(Vec3fa(1.f, 1.f, 1.f));
  T.p = Vec3fa(qdc.translation_x, qdc.translation_y, qdc.translation_z);

  AffineSpace3fa S = AffineSpace3fa::scale(Vec3fa(1.f, 1.f, 1.f));
  S.l.vx.x = qdc.scale_x; S.l.vy.x = qdc.skew_xy; S.l.vz.x = qdc.skew_xz; S.p.x = qdc.shift_x;
                          S.l.vy.y = qdc.scale_y; S.l.vz.y = qdc.skew_yz; S.p.y = qdc.shift_y;
                                                  S.l.vz.z = qdc.scale_z; S.p.z = qdc.shift_z;

  Quaternion3f q = Quaternion3f(Vec4f(
    qdc.quaternion_r, qdc.quaternion_i, qdc.quaternion_j, qdc.quaternion_k));

  AffineSpace3fa R = AffineSpace3fa(LinearSpace3fa(q));
  return T * R * S;
}